

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

void __thiscall
llama_kv_cache_unified::seq_add
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,
          llama_pos delta)

{
  undefined4 *puVar1;
  int *piVar2;
  int iVar3;
  pointer plVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  llama_kv_cell *this_00;
  uint32_t i;
  ulong uVar11;
  uint local_38;
  llama_seq_id local_34;
  
  if (delta != 0) {
    iVar9 = 0;
    if (0 < p0) {
      iVar9 = p0;
    }
    iVar10 = 0x7fffffff;
    if ((uint)p1 < 0x7fffffff) {
      iVar10 = p1;
    }
    if (iVar9 != iVar10) {
      uVar6 = this->size;
      if (this->recurrent == false) {
        lVar7 = 0;
        local_38 = uVar6;
        local_34 = seq_id;
        for (uVar11 = 0; uVar11 < uVar6; uVar11 = uVar11 + 1) {
          bVar5 = llama_kv_cell::has_seq_id
                            ((llama_kv_cell *)
                             ((long)&((this->cells).
                                      super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pos + lVar7),
                             &local_34);
          if (bVar5) {
            plVar4 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar3 = *(int *)((long)&plVar4->pos + lVar7);
            if (iVar3 < iVar10 && iVar9 <= iVar3) {
              this->has_shift = true;
              piVar2 = (int *)((long)&plVar4->delta + lVar7);
              *piVar2 = *piVar2 + delta;
              *(int *)((long)&plVar4->pos + lVar7) = iVar3 + delta;
              if (iVar3 + delta < 0) {
                if (*(long *)((long)&(plVar4->seq_id)._M_t._M_impl + lVar7 + 0x28) != 0) {
                  this->used = this->used - 1;
                }
                puVar1 = (undefined4 *)((long)&plVar4->pos + lVar7);
                *puVar1 = 0xffffffff;
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                clear((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)(puVar1 + 4));
                if (local_38 == this->size) {
                  local_38 = (uint)uVar11;
                }
              }
            }
          }
          uVar6 = this->size;
          lVar7 = lVar7 + 0x40;
        }
        uVar8 = 0;
        if (local_38 != uVar6) {
          uVar8 = local_38;
        }
        this->head = uVar8;
      }
      else if ((uint)seq_id < uVar6 && -1 < seq_id) {
        plVar4 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)plVar4[(uint)seq_id].tail;
        if (-1 < lVar7) {
          this_00 = plVar4 + lVar7;
          bVar5 = llama_kv_cell::has_seq_id(this_00,&local_34);
          if ((bVar5) && (iVar3 = this_00->pos, iVar3 < iVar10 && iVar9 <= iVar3)) {
            this_00->pos = iVar3 + delta;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_add(llama_seq_id seq_id, llama_pos p0, llama_pos p1, llama_pos delta) {
    if (delta == 0) {
        return;
    }

    uint32_t new_head = size;

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be shifted
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos += delta;
                }
            }
        }
        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;
            cells[i].pos   += delta;
            cells[i].delta += delta;

            if (cells[i].pos < 0) {
                if (!cells[i].is_empty()) {
                    used--;
                }
                cells[i].pos = -1;
                cells[i].seq_id.clear();
                if (new_head == size) {
                    new_head = i;
                }
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    // Otherwise we just start the next search from the beginning.
    head = new_head != size ? new_head : 0;
}